

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderInvarianceRule6Test::verifyResultData
          (TessellationShaderInvarianceRule6Test *this,void **all_iterations_data)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  _tessellation_primitive_mode primitive_mode_00;
  size_type sVar7;
  const_reference pvVar8;
  const_reference value;
  const_reference pvVar9;
  float *tessellated_vertex_data;
  TestLog *this_00;
  MessageBuilder *pMVar10;
  TestError *this_01;
  _tessellation_primitive_mode primitive_mode_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  _test_iterations *local_258;
  uint local_250;
  uint local_24c;
  MessageBuilder local_230;
  undefined1 local_b0 [8];
  string primitive_mode_str;
  float *curr_triangle;
  uint n_curr_set_triangle;
  bool has_base_set_triangle_been_found;
  float *base_triangle_vertex3;
  float *base_triangle_vertex2;
  float *base_triangle_vertex1;
  uint n_base_triangle;
  uint n_triangles_in_curr_set;
  float *set_vertex_data;
  _test_iteration *set_test;
  uint n_set;
  float *base_vertex_data;
  _test_iteration *base_test;
  uint n_triangles_in_base_set;
  _test_iterations *test_iterations;
  _tessellation_primitive_mode primitive_mode;
  uint n_sets;
  uint n_base_iteration;
  uint n_iteration;
  void **all_iterations_data_local;
  TessellationShaderInvarianceRule6Test *this_local;
  undefined8 uVar11;
  
  n_sets = 0;
  do {
    if (1 < n_sets) {
      return;
    }
    if (n_sets == 0) {
      local_24c = 0;
      sVar7 = std::
              vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
              ::size(&this->m_test_triangles_iterations);
      local_250 = (uint)sVar7;
    }
    else {
      sVar7 = std::
              vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
              ::size(&this->m_test_triangles_iterations);
      local_24c = (uint)sVar7;
      sVar7 = std::
              vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
              ::size(&this->m_test_quads_iterations);
      local_250 = (uint)sVar7;
    }
    primitive_mode_00 = TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
    if (n_sets == 0) {
      primitive_mode_00 = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
      local_258 = &this->m_test_triangles_iterations;
    }
    else {
      local_258 = &this->m_test_quads_iterations;
    }
    pvVar8 = std::
             vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
             ::operator[](local_258,0);
    uVar1 = pvVar8->n_vertices;
    pvVar8 = std::
             vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
             ::operator[](local_258,0);
    pvVar3 = all_iterations_data[local_24c];
    for (set_test._4_4_ = 1; set_test._4_4_ < local_250; set_test._4_4_ = set_test._4_4_ + 1) {
      value = std::
              vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
              ::operator[](local_258,(ulong)set_test._4_4_);
      pvVar4 = all_iterations_data[local_24c + set_test._4_4_];
      pvVar9 = std::
               vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
               ::operator[](local_258,(ulong)set_test._4_4_);
      uVar2 = pvVar9->n_vertices;
      for (base_triangle_vertex1._0_4_ = 0; (uint)base_triangle_vertex1 < uVar1 / 3;
          base_triangle_vertex1._0_4_ = (uint)base_triangle_vertex1 + 1) {
        tessellated_vertex_data =
             (float *)((long)pvVar3 + (ulong)((uint)base_triangle_vertex1 * 9) * 4);
        bVar5 = TessellationShaderUtils::isOuterEdgeVertex
                          (primitive_mode_00,tessellated_vertex_data);
        if (((!bVar5) &&
            (bVar5 = TessellationShaderUtils::isOuterEdgeVertex
                               (primitive_mode_00,tessellated_vertex_data + 3), !bVar5)) &&
           (bVar5 = TessellationShaderUtils::isOuterEdgeVertex
                              (primitive_mode_00,tessellated_vertex_data + 6), !bVar5)) {
          bVar5 = false;
          uVar11 = extraout_RDX;
          for (curr_triangle._0_4_ = 0; primitive_mode_01 = (_tessellation_primitive_mode)uVar11,
              (uint)curr_triangle < uVar2 / 3; curr_triangle._0_4_ = (uint)curr_triangle + 1) {
            primitive_mode_str.field_2._8_8_ = (long)pvVar4 + (ulong)((uint)curr_triangle * 9) * 4;
            bVar6 = TessellationShaderUtils::isTriangleDefined
                              (tessellated_vertex_data,(float *)primitive_mode_str.field_2._8_8_);
            primitive_mode_01 = (_tessellation_primitive_mode)extraout_RDX_00;
            if (bVar6) {
              bVar5 = true;
              break;
            }
            uVar11 = extraout_RDX_00;
          }
          if (!bVar5) {
            TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                      ((string *)local_b0,(TessellationShaderUtils *)(ulong)pvVar8->primitive_mode,
                       primitive_mode_01);
            this_00 = tcu::TestContext::getLog
                                ((this->super_TessellationShaderInvarianceBaseTest).
                                 super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_230,this_00,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar10 = tcu::MessageBuilder::operator<<
                                (&local_230,(char (*) [21])"For primitive mode [");
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_b0);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x29ea7ce);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(char (*) [34])", base inner tessellation levels:");
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2c3fdfc);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pvVar8->inner_tess_levels);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pvVar8->inner_tess_levels + 1);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x29ea7ce);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(char (*) [34])", base outer tessellation levels:");
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2c3fdfc);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pvVar8->outer_tess_levels);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pvVar8->outer_tess_levels + 1);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pvVar8->outer_tess_levels + 2);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pvVar8->outer_tess_levels + 3);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x29ea7ce);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(char (*) [39])", reference inner tessellation levels:");
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2c3fdfc);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value->inner_tess_levels);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value->inner_tess_levels + 1);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x29ea7ce);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(char (*) [39])", reference outer tessellation levels:");
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2c3fdfc);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value->outer_tess_levels);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value->outer_tess_levels + 1);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value->outer_tess_levels + 2);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value->outer_tess_levels + 3);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x29ea7ce);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(char (*) [93])
                                         ", the following triangle formed during base tessellation run was not found in reference run:"
                                );
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2c3fdfc);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,tessellated_vertex_data);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,tessellated_vertex_data + 1);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,tessellated_vertex_data + 2);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])"]x");
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2c3fdfc);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,tessellated_vertex_data + 3);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,tessellated_vertex_data + 4);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,tessellated_vertex_data + 5);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])"]x");
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2c3fdfc);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,tessellated_vertex_data + 6);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,tessellated_vertex_data + 7);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,tessellated_vertex_data + 8);
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_230);
            this_01 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_01,"Implementation does not appear to be rule 6-conformant",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                       ,0x9d4);
            __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
        }
      }
    }
    n_sets = n_sets + 1;
  } while( true );
}

Assistant:

void TessellationShaderInvarianceRule6Test::verifyResultData(const void** all_iterations_data)
{
	/* Run two separate iterations:
	 *
	 * a) triangles
	 * b) quads
	 */

	for (unsigned int n_iteration = 0; n_iteration < 2 /* quads, triangles */; ++n_iteration)
	{
		const unsigned int n_base_iteration =
			(n_iteration == 0) ? 0 : (const unsigned int)m_test_triangles_iterations.size();

		const unsigned int n_sets = (n_iteration == 0) ? (const unsigned int)m_test_triangles_iterations.size() :
														 (const unsigned int)m_test_quads_iterations.size();

		_tessellation_primitive_mode primitive_mode = (n_iteration == 0) ?
														  TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES :
														  TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;

		const _test_iterations& test_iterations =
			(n_iteration == 0) ? m_test_triangles_iterations : m_test_quads_iterations;

		const unsigned int n_triangles_in_base_set = test_iterations[0].n_vertices / 3 /* vertices per triangle */;

		DE_ASSERT(test_iterations.size() != 0);

		/* For each iteration, verify that all vertices generated for all three vertex spacing modes.
		 * are exactly the same (but in different order) */
		const _test_iteration& base_test		= test_iterations[0];
		const float*		   base_vertex_data = (const float*)all_iterations_data[n_base_iteration + 0];

		for (unsigned int n_set = 1; n_set < n_sets; ++n_set)
		{
			const _test_iteration& set_test		   = test_iterations[n_set];
			const float*		   set_vertex_data = (const float*)all_iterations_data[n_base_iteration + n_set];

			/* We're operating on triangles so make sure the amount of vertices we're dealing with is
			 * divisible by 3 */
			DE_ASSERT((test_iterations[n_set].n_vertices % 3) == 0);

			const unsigned int n_triangles_in_curr_set = test_iterations[n_set].n_vertices / 3;

			/* Take base triangles and make sure they can be found in iteration-specific set.
			 * Now, thing to keep in mind here is that we must not assume any specific vertex
			 * and triangle order which is why the slow search. */
			for (unsigned int n_base_triangle = 0; n_base_triangle < n_triangles_in_base_set; ++n_base_triangle)
			{
				/* Extract base triangle data first */
				const float* base_triangle_vertex1 = base_vertex_data +
													 n_base_triangle * 3 *		/* vertices per triangle */
														 3;						/* components */
				const float* base_triangle_vertex2 = base_triangle_vertex1 + 3; /* components */
				const float* base_triangle_vertex3 = base_triangle_vertex2 + 3; /* components */

				/* Only interior triangles should be left intact. Is this an interior triangle? */
				if (!TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex1) &&
					!TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex2) &&
					!TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex3))
				{
					/* Iterate through all triangles in considered set */
					bool has_base_set_triangle_been_found = false;

					for (unsigned int n_curr_set_triangle = 0; n_curr_set_triangle < n_triangles_in_curr_set;
						 ++n_curr_set_triangle)
					{
						const float* curr_triangle = set_vertex_data +
													 n_curr_set_triangle * 3 * /* vertices per triangle */
														 3;					   /* components */

						if (TessellationShaderUtils::isTriangleDefined(base_triangle_vertex1, curr_triangle))
						{
							has_base_set_triangle_been_found = true;

							break;
						}
					} /* for (all triangles in currently processed set) */

					if (!has_base_set_triangle_been_found)
					{
						std::string primitive_mode_str =
							TessellationShaderUtils::getESTokenForPrimitiveMode(base_test.primitive_mode);

						m_testCtx.getLog()
							<< tcu::TestLog::Message << "For primitive mode [" << primitive_mode_str << "]"
							<< ", base inner tessellation levels:"
							<< "[" << base_test.inner_tess_levels[0] << ", " << base_test.inner_tess_levels[1] << "]"
							<< ", base outer tessellation levels:"
							<< "[" << base_test.outer_tess_levels[0] << ", " << base_test.outer_tess_levels[1] << ", "
							<< base_test.outer_tess_levels[2] << ", " << base_test.outer_tess_levels[3] << "]"
							<< ", reference inner tessellation levels:"
							<< "[" << set_test.inner_tess_levels[0] << ", " << set_test.inner_tess_levels[1] << "]"
							<< ", reference outer tessellation levels:"
							<< "[" << set_test.outer_tess_levels[0] << ", " << set_test.outer_tess_levels[1] << ", "
							<< set_test.outer_tess_levels[2] << ", " << set_test.outer_tess_levels[3] << "]"
							<< ", the following triangle formed during base tessellation run was not found in "
							   "reference run:"
							<< "[" << base_triangle_vertex1[0] << ", " << base_triangle_vertex1[1] << ", "
							<< base_triangle_vertex1[2] << "]x"
							<< "[" << base_triangle_vertex2[0] << ", " << base_triangle_vertex2[1] << ", "
							<< base_triangle_vertex2[2] << "]x"
							<< "[" << base_triangle_vertex3[0] << ", " << base_triangle_vertex3[1] << ", "
							<< base_triangle_vertex3[2]

							<< tcu::TestLog::EndMessage;

						TCU_FAIL("Implementation does not appear to be rule 6-conformant");
					} /* if (triangle created during base run was not found in reference run) */
				}	 /* if (base triangle is interior) */
			}		  /* for (all base set's vertices) */
		}			  /* for (all sets) */
	}				  /* for (both primitive types) */
}